

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O3

FILE * __thiscall MemPlumberInternal::openFile(MemPlumberInternal *this,char *fileName,bool append)

{
  FILE *pFVar1;
  
  pFVar1 = _stdout;
  if ((*fileName != '\0') &&
     (((!append || (pFVar1 = fopen(fileName,"at"), pFVar1 == (FILE *)0x0)) &&
      (pFVar1 = fopen(fileName,"wt"), pFVar1 == (FILE *)0x0)))) {
    fprintf(_stderr,"WARNING: couldn\'t open file `%s`\n",fileName);
    pFVar1 = (FILE *)0x0;
  }
  return (FILE *)pFVar1;
}

Assistant:

FILE* openFile(const char* fileName, bool append) {
        if (strncmp(fileName, "", 1000) == 0) { // dump to stdout
            return stdout;
        }
        else { // dump to file
            FILE* file = NULL;
            if (!append) { // override the file
                file = fopen(fileName, "wt");
            }
            else { // append the file
                file = fopen(fileName, "at"); // try append
                if (!file) { // if append failed, create a new file
                    file = fopen(fileName, "wt");
                }
            }

            if (!file) {
                fprintf(stderr, "WARNING: couldn't open file `%s`\n", fileName);
            }

            return file;
        }
    }